

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O2

ON_ComponentManifestItem_PRIVATE * __thiscall
ON_ComponentManifestImpl::ChangeItemNameHash
          (ON_ComponentManifestImpl *this,ON_UUID *manifest_item_id,ON_NameHash *new_name_hash)

{
  undefined8 uVar1;
  uint uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  ON__UINT32 OVar5;
  ON__UINT8 OVar6;
  ON__UINT8 OVar7;
  ON__UINT8 OVar8;
  ON__UINT8 OVar9;
  bool bVar10;
  ON_ComponentManifestItem_PRIVATE *manifest_item;
  ON_ComponentManifestHash32TableItem *pOVar11;
  ON_ComponentNameHash32Table *this_00;
  char *sFormat;
  int line_number;
  ON_NameHash old_name_hash;
  ON_NameHash local_58;
  
  bVar10 = ON_NameHash::IsInvalidNameHash(new_name_hash);
  if (bVar10) {
    sFormat = "new_name_hash parameter is not valid.";
    line_number = 0x1003;
  }
  else {
    manifest_item = ItemFromManifestId(this,manifest_item_id);
    if (manifest_item == (ON_ComponentManifestItem_PRIVATE *)0x0) {
      sFormat = "id not valid.";
      line_number = 0x100b;
    }
    else {
      local_58.m_parent_id.Data4 =
           *&(manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_parent_id.Data4;
      local_58.m_flags = (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_flags;
      local_58.m_sha1_hash.m_digest[0] =
           (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_sha1_hash.m_digest[0];
      local_58.m_sha1_hash.m_digest[1] =
           (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_sha1_hash.m_digest[1];
      local_58.m_sha1_hash.m_digest[2] =
           (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_sha1_hash.m_digest[2];
      local_58.m_sha1_hash.m_digest[3] =
           (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_sha1_hash.m_digest[3];
      local_58.m_sha1_hash.m_digest._4_8_ =
           *(undefined8 *)
            ((manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_sha1_hash.m_digest + 4);
      local_58.m_sha1_hash.m_digest._12_8_ =
           *(undefined8 *)
            ((manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_sha1_hash.m_digest + 0xc)
      ;
      local_58.m_parent_id.Data1 =
           (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_parent_id.Data1;
      local_58.m_parent_id.Data2 =
           (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_parent_id.Data2;
      local_58.m_parent_id.Data3 =
           (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_parent_id.Data3;
      bVar10 = ::operator==(&local_58,new_name_hash);
      if (bVar10) {
        return manifest_item;
      }
      bVar10 = ON_ModelComponent::UniqueNameRequired
                         ((manifest_item->super_ON_ComponentManifestItem).m_component_type);
      if (!bVar10) {
LAB_003e4ced:
        this_00 = ComponentNameHash32Table
                            (this,(manifest_item->super_ON_ComponentManifestItem).m_component_type);
        bVar10 = ON_NameHash::IsValidAndNotEmpty(&local_58);
        if ((bVar10) &&
           (bVar10 = ON_ComponentNameHash32Table::RemoveManifestItem(this_00,manifest_item), !bVar10
           )) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
                     ,0x102a,"","old name not in manifest.");
        }
        this->m_manifest_content_version_number = this->m_manifest_content_version_number + 1;
        *(undefined8 *)(manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_parent_id.Data4
             = *(undefined8 *)(new_name_hash->m_parent_id).Data4;
        OVar5 = new_name_hash->m_flags;
        OVar6 = (new_name_hash->m_sha1_hash).m_digest[0];
        OVar7 = (new_name_hash->m_sha1_hash).m_digest[1];
        OVar8 = (new_name_hash->m_sha1_hash).m_digest[2];
        OVar9 = (new_name_hash->m_sha1_hash).m_digest[3];
        uVar1 = *(undefined8 *)((new_name_hash->m_sha1_hash).m_digest + 4);
        uVar2 = (new_name_hash->m_parent_id).Data1;
        uVar3 = (new_name_hash->m_parent_id).Data2;
        uVar4 = (new_name_hash->m_parent_id).Data3;
        *(undefined8 *)
         ((manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_sha1_hash.m_digest + 0xc) =
             *(undefined8 *)((new_name_hash->m_sha1_hash).m_digest + 0xc);
        (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_parent_id.Data1 = uVar2;
        (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_parent_id.Data2 = uVar3;
        (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_parent_id.Data3 = uVar4;
        (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_flags = OVar5;
        (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_sha1_hash.m_digest[0] = OVar6;
        (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_sha1_hash.m_digest[1] = OVar7;
        (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_sha1_hash.m_digest[2] = OVar8;
        (manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_sha1_hash.m_digest[3] = OVar9;
        *(undefined8 *)
         ((manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_sha1_hash.m_digest + 4) =
             uVar1;
        bVar10 = ON_NameHash::IsValidAndNotEmpty(new_name_hash);
        if (!bVar10) {
          return manifest_item;
        }
        ON_ComponentNameHash32Table::AddManifestItem(this_00,manifest_item);
        return manifest_item;
      }
      bVar10 = ON_NameHash::IsValidAndNotEmpty(new_name_hash);
      if (bVar10) {
        pOVar11 = ON_ComponentNameHash32Table::FirstManifestItemWithName
                            (&this->m_unique_name_hash_table,
                             (manifest_item->super_ON_ComponentManifestItem).m_component_type,
                             new_name_hash);
        if (pOVar11 == (ON_ComponentManifestHash32TableItem *)0x0) goto LAB_003e4ced;
        sFormat = "new name is in use.";
        line_number = 0x101f;
      }
      else {
        sFormat = "new_name_hash must be valid and not empty.";
        line_number = 0x1019;
      }
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
             ,line_number,"",sFormat);
  return (ON_ComponentManifestItem_PRIVATE *)0x0;
}

Assistant:

const ON_ComponentManifestItem_PRIVATE* ON_ComponentManifestImpl::ChangeItemNameHash(
  const ON_UUID& manifest_item_id,
  const ON_NameHash& new_name_hash
  )
{
  if (new_name_hash.IsInvalidNameHash())
  {
    ON_ERROR("new_name_hash parameter is not valid.");
    return nullptr;
  }

  ON_ComponentManifestItem_PRIVATE* item = const_cast<ON_ComponentManifestItem_PRIVATE*>(ItemFromManifestId(manifest_item_id));

  if (nullptr == item)
  {
    ON_ERROR("id not valid.");
    return nullptr;
  }

  const ON_NameHash old_name_hash = item->m_name_hash;
  
  if ( old_name_hash == new_name_hash )
    return item;
  
  const bool bUniqueNameRequired = ON_ModelComponent::UniqueNameRequired(item->m_component_type);
  if (bUniqueNameRequired)
  {
    if (false == new_name_hash.IsValidAndNotEmpty())
    {
      ON_ERROR("new_name_hash must be valid and not empty.");
      return nullptr;
    }
    const ON_ComponentManifestHash32TableItem* hash_item = m_unique_name_hash_table.FirstManifestItemWithName(item->m_component_type,new_name_hash);
    if (nullptr != hash_item )
    {
      ON_ERROR("new name is in use.");
      return nullptr;
    }
  }

  ON_ComponentNameHash32Table& name_hash_table = ComponentNameHash32Table(item->m_component_type);

  if (old_name_hash.IsValidAndNotEmpty())
  {
    if (false == name_hash_table.RemoveManifestItem(item))
    {
      ON_ERROR("old name not in manifest.");
    }
  }

  m_manifest_content_version_number++;
  item->m_name_hash = new_name_hash;
  if ( new_name_hash.IsValidAndNotEmpty() )
    name_hash_table.AddManifestItem(item);

  return item;
}